

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O2

char * is_complete(char *buf,char *buf_end,size_t last_len,int *ret)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar4 = buf + (last_len - 3);
  if (last_len < 3) {
    pcVar4 = buf;
  }
  iVar3 = 0;
  iVar2 = -2;
  do {
    if (pcVar4 == buf_end) goto LAB_00118f7b;
    pcVar5 = pcVar4 + 1;
    if (*pcVar4 == '\n') {
LAB_00118f69:
      iVar1 = iVar3 + 1;
    }
    else {
      iVar1 = 0;
      if (*pcVar4 == '\r') {
        if (pcVar5 == buf_end) {
LAB_00118f7b:
          *ret = iVar2;
          return (char *)0x0;
        }
        if (*pcVar5 != '\n') {
          iVar2 = -1;
          goto LAB_00118f7b;
        }
        pcVar5 = pcVar4 + 2;
        goto LAB_00118f69;
      }
    }
    iVar3 = iVar1;
    pcVar4 = pcVar5;
    if (iVar3 == 2) {
      return pcVar5;
    }
  } while( true );
}

Assistant:

static const char *is_complete(const char *buf, const char *buf_end,
							   size_t last_len, int *ret)
{
	int ret_cnt = 0;
	buf = last_len < 3 ? buf : buf + last_len - 3;

	while (1) {
		CHECK_EOF();
		if (*buf == '\015') {
			++buf;
			CHECK_EOF();
			EXPECT_CHAR('\012');
			++ret_cnt;
		} else if (*buf == '\012') {
			++buf;
			++ret_cnt;
		} else {
			++buf;
			ret_cnt = 0;
		}
		if (ret_cnt == 2) {
			return buf;
		}
	}

	*ret = -2;
	return NULL;
}